

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointlight.cpp
# Opt level: O0

void __thiscall PointLight::PointLight(PointLight *this,vec3 *p,ColorRGB c)

{
  vec3 *p_local;
  PointLight *this_local;
  ColorRGB c_local;
  
  glm::detail::tvec3<float>::tvec3(&this->position);
  ColorRGB::ColorRGB(&this->color);
  glm::detail::tvec3<float>::operator=(&this->position,p);
  (this->color).r = (float)(int)c._0_8_;
  (this->color).g = (float)(int)((ulong)c._0_8_ >> 0x20);
  (this->color).b = c.b;
  return;
}

Assistant:

PointLight::PointLight(glm::vec3 p, ColorRGB c) {
    position = p;
    color = c;
}